

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O0

void __thiscall Assimp::BaseImporter::UpdateImporterScale(BaseImporter *this,Importer *pImp)

{
  Logger *this_00;
  basic_formatter *this_01;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_40;
  double local_20;
  double activeScale;
  Importer *pImp_local;
  BaseImporter *this_local;
  
  activeScale = (double)pImp;
  pImp_local = (Importer *)this;
  if (pImp == (Importer *)0x0) {
    __assert_fail("pImp != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/BaseImporter.cpp"
                  ,0x51,"virtual void Assimp::BaseImporter::UpdateImporterScale(Importer *)");
  }
  if ((this->importerScale == 0.0) && (!NAN(this->importerScale))) {
    __assert_fail("importerScale != 0.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/BaseImporter.cpp"
                  ,0x52,"virtual void Assimp::BaseImporter::UpdateImporterScale(Importer *)");
  }
  if ((this->fileScale == 0.0) && (!NAN(this->fileScale))) {
    __assert_fail("fileScale != 0.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/BaseImporter.cpp"
                  ,0x53,"virtual void Assimp::BaseImporter::UpdateImporterScale(Importer *)");
  }
  local_20 = this->importerScale * this->fileScale;
  Importer::SetPropertyFloat(pImp,"APP_SCALE_FACTOR",(float)local_20);
  this_00 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[34]>(&local_1b8,(char (*) [34])"UpdateImporterScale scale set: %f");
  this_01 = (basic_formatter *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       &local_1b8,&local_20);
  Formatter::basic_formatter::operator_cast_to_string(&local_40,this_01);
  Logger::debug(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_1b8);
  return;
}

Assistant:

void BaseImporter::UpdateImporterScale( Importer* pImp )
{
    ai_assert(pImp != nullptr);
    ai_assert(importerScale != 0.0);
    ai_assert(fileScale != 0.0);

    double activeScale = importerScale * fileScale;

    // Set active scaling
    pImp->SetPropertyFloat( AI_CONFIG_APP_SCALE_KEY, static_cast<float>( activeScale) );

    ASSIMP_LOG_DEBUG_F("UpdateImporterScale scale set: %f", activeScale );
}